

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O0

int nn_device_loopback(nn_device_recipe *device,int s)

{
  int *piVar1;
  size_t local_30;
  size_t opsz;
  int local_20;
  int op;
  int rc;
  int s_local;
  nn_device_recipe *device_local;
  
  local_30 = 4;
  op = s;
  _rc = device;
  local_20 = nn_getsockopt(s,0,0xc,(void *)((long)&opsz + 4),&local_30);
  if (local_20 == 0) {
    if (local_30 != 4) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","opsz == sizeof (op)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/devices/device.c"
              ,0xd6);
      fflush(_stderr);
      nn_err_abort();
    }
    if (opsz._4_4_ == 2) {
      local_20 = 0;
      do {
        local_20 = nn_device_mvmsg(_rc,op,op,0);
      } while (-1 < local_20);
    }
    else {
      piVar1 = __errno_location();
      *piVar1 = 0x16;
    }
  }
  return -1;
}

Assistant:

int nn_device_loopback (struct nn_device_recipe *device, int s)
{
    int rc;
    int op;
    size_t opsz;

    /*  Check whether the socket is a "raw" socket. */
    opsz = sizeof (op);
    rc = nn_getsockopt (s, NN_SOL_SOCKET, NN_DOMAIN, &op, &opsz);
    if (nn_slow (rc != 0))
        return -1;
    nn_assert (opsz == sizeof (op));
    if (op != AF_SP_RAW) {
        errno = EINVAL;
        return -1;
    }

    for (;;) {
        rc = nn_device_mvmsg (device, s, s, 0);
        if (nn_slow (rc < 0))
            return -1;
    }
}